

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O3

void Sfm_TimGateArrival(Sfm_Tim_t *p,Mio_Gate_t *pGate,int **pTimesIn,int *pTimeOut)

{
  int *piVar1;
  Mio_PinPhase_t MVar2;
  int iVar3;
  Mio_Pin_t *pPin;
  int iVar4;
  long lVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  
  *pTimesIn = (int *)0x0;
  pPin = Mio_GateReadPins((Mio_Gate_t *)p);
  if (pPin == (Mio_Pin_t *)0x0) {
    lVar5 = 0;
  }
  else {
    lVar5 = 0;
    do {
      piVar1 = (int *)(&pGate->pName)[lVar5];
      MVar2 = Mio_PinReadPhase(pPin);
      dVar7 = Mio_PinReadDelayBlockRise(pPin);
      dVar8 = Mio_PinReadDelayBlockFall(pPin);
      iVar3 = *(int *)pTimesIn;
      if (MVar2 == MIO_PHASE_INV) {
        iVar4 = *(int *)((long)pTimesIn + 4);
LAB_004c644b:
        iVar6 = (int)(dVar7 * 1000.0) + piVar1[1];
        if (iVar6 < iVar3) {
          iVar6 = iVar3;
        }
        *(int *)pTimesIn = iVar6;
        iVar3 = (int)(dVar8 * 1000.0) + *piVar1;
        if (iVar3 < iVar4) {
          iVar3 = iVar4;
        }
        *(int *)((long)pTimesIn + 4) = iVar3;
      }
      else {
        iVar4 = *piVar1 + (int)(dVar7 * 1000.0);
        if (iVar3 <= iVar4) {
          iVar3 = iVar4;
        }
        *(int *)pTimesIn = iVar3;
        iVar4 = piVar1[1] + (int)(dVar8 * 1000.0);
        if (iVar4 < *(int *)((long)pTimesIn + 4)) {
          iVar4 = *(int *)((long)pTimesIn + 4);
        }
        *(int *)((long)pTimesIn + 4) = iVar4;
        if (MVar2 != MIO_PHASE_NONINV) goto LAB_004c644b;
      }
      pPin = Mio_PinReadNext(pPin);
      lVar5 = lVar5 + 1;
    } while (pPin != (Mio_Pin_t *)0x0);
  }
  iVar3 = Mio_GateReadPinNum((Mio_Gate_t *)p);
  if ((int)lVar5 != iVar3) {
    __assert_fail("i == Mio_GateReadPinNum(pGate)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmTim.c"
                  ,0x61,"void Sfm_TimGateArrival(Sfm_Tim_t *, Mio_Gate_t *, int **, int *)");
  }
  return;
}

Assistant:

static inline void Sfm_TimGateArrival( Sfm_Tim_t * p, Mio_Gate_t * pGate, int ** pTimesIn, int * pTimeOut )
{
    Mio_Pin_t * pPin;  int i = 0;
    pTimeOut[0] = pTimeOut[1] = 0;
    Mio_GateForEachPin( pGate, pPin )
        Sfm_TimEdgeArrival( p, pPin, pTimesIn[i++], pTimeOut );
    assert( i == Mio_GateReadPinNum(pGate) );
}